

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O1

bool anon_unknown.dwarf_11283::SolverDpllTriadSimd<0>::InitPencilmarkByBox(char *input,State *state)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  int elm_i;
  long lVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  undefined1 *puVar10;
  undefined1 *__dest;
  long lVar11;
  bool bVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  char buf [736];
  Cells16 local_360;
  undefined1 local_340 [784];
  undefined1 auVar15 [32];
  
  __dest = local_340;
  memcpy(__dest,input,0x2d9);
  uVar4 = 0;
  auVar17 = ZEXT1664(CONCAT115(0x2e,CONCAT114(0x2e,CONCAT113(0x2e,CONCAT112(0x2e,CONCAT111(0x2e,
                                                  CONCAT110(0x2e,CONCAT19(0x2e,CONCAT18(0x2e,
                                                  0x2e2e2e2e2e2e2e2e)))))))));
  bVar12 = false;
  do {
    lVar11 = 0;
    puVar10 = __dest;
    do {
      uVar3 = 0;
      lVar6 = 0;
      auVar16 = ZEXT3264(CONCAT230(0x1ff,CONCAT228(0x1ff,CONCAT226(0x1ff,CONCAT224(0x1ff,CONCAT222(
                                                  0x1ff,CONCAT220(0x1ff,CONCAT218(0x1ff,CONCAT216(
                                                  0x1ff,CONCAT214(0x1ff,CONCAT212(0x1ff,CONCAT210(
                                                  0x1ff,CONCAT28(0x1ff,0x1ff01ff01ff01ff))))))))))))
                        );
      puVar5 = puVar10;
      do {
        lVar8 = 0;
        uVar7 = uVar3;
        do {
          if (0xf < uVar7) goto LAB_001067ef;
          uVar1 = vpcmpb_avx512vl(auVar17._0_16_,*(undefined1 (*) [16])(puVar5 + lVar8),4);
          uVar9 = (uint)uVar1 & 0x1ff;
          auVar14 = auVar16._0_16_;
          auVar15 = auVar16._0_32_;
          switch(uVar7) {
          case 0:
            auVar14 = vpinsrw_avx(auVar14,uVar9,0);
            auVar13 = ZEXT1632(auVar14);
            break;
          case 1:
            auVar14 = vpinsrw_avx(auVar14,uVar9,1);
            auVar13 = ZEXT1632(auVar14);
            break;
          case 2:
            auVar14 = vpinsrw_avx(auVar14,uVar9,2);
            auVar13 = ZEXT1632(auVar14);
            break;
          case 3:
            auVar14 = vpinsrw_avx(auVar14,uVar9,3);
            auVar13 = ZEXT1632(auVar14);
            break;
          case 4:
            auVar14 = vpinsrw_avx(auVar14,uVar9,4);
            auVar13 = ZEXT1632(auVar14);
            break;
          case 5:
            auVar14 = vpinsrw_avx(auVar14,uVar9,5);
            auVar13 = ZEXT1632(auVar14);
            break;
          case 6:
            auVar14 = vpinsrw_avx(auVar14,uVar9,6);
            auVar13 = ZEXT1632(auVar14);
            break;
          case 7:
            auVar14 = vpinsrw_avx(auVar14,uVar9,7);
            auVar13 = ZEXT1632(auVar14);
            break;
          case 8:
            auVar13 = vpbroadcastw_avx512vl();
            auVar13 = vpblendw_avx2(auVar15,auVar13,1);
            goto LAB_001067e9;
          case 9:
            auVar13 = vpbroadcastw_avx512vl();
            auVar13 = vpblendw_avx2(auVar15,auVar13,2);
            goto LAB_001067e9;
          case 10:
            auVar13 = vpbroadcastw_avx512vl();
            auVar13 = vpblendw_avx2(auVar15,auVar13,4);
            goto LAB_001067e9;
          case 0xb:
            auVar13 = vpbroadcastw_avx512vl();
            auVar13 = vpblendw_avx2(auVar15,auVar13,8);
            goto LAB_001067e9;
          case 0xc:
            auVar13 = vpbroadcastw_avx512vl();
            auVar13 = vpblendw_avx2(auVar15,auVar13,0x10);
            goto LAB_001067e9;
          case 0xd:
            auVar13 = vpbroadcastw_avx512vl();
            auVar13 = vpblendw_avx2(auVar15,auVar13,0x20);
            goto LAB_001067e9;
          case 0xe:
            auVar13 = vpbroadcastw_avx512vl();
            auVar13 = vpblendw_avx2(auVar15,auVar13,0x40);
            goto LAB_001067e9;
          case 0xf:
            auVar13 = vpbroadcastw_avx512vl();
            auVar13 = vpblendw_avx2(auVar15,auVar13,0x80);
LAB_001067e9:
            auVar15 = vpblendd_avx2(auVar15,auVar13,0xf0);
            auVar16 = ZEXT3264(auVar15);
            goto LAB_001067ef;
          }
          auVar15 = vpblendd_avx2(auVar15,auVar13,0xf);
          auVar16 = ZEXT3264(auVar15);
LAB_001067ef:
          lVar8 = lVar8 + 9;
          uVar7 = uVar7 + 1;
        } while (lVar8 != 0x1b);
        lVar6 = lVar6 + 1;
        puVar5 = puVar5 + 0x51;
        uVar3 = uVar3 + 4;
      } while (lVar6 != 3);
      local_360.vec = auVar16._0_32_;
      bVar2 = BoxRestrict<0>(state,(int)lVar11 + (int)uVar4 * 3,&local_360);
      if (!bVar2) {
        return bVar12;
      }
      lVar11 = lVar11 + 1;
      puVar10 = puVar10 + 0x1b;
      auVar17 = ZEXT1664(CONCAT115(0x2e,CONCAT114(0x2e,CONCAT113(0x2e,CONCAT112(0x2e,CONCAT111(0x2e,
                                                  CONCAT110(0x2e,CONCAT19(0x2e,CONCAT18(0x2e,
                                                  0x2e2e2e2e2e2e2e2e)))))))));
    } while (lVar11 != 3);
    bVar12 = 1 < uVar4;
    uVar4 = uVar4 + 1;
    __dest = __dest + 0xf3;
    if (uVar4 == 3) {
      return bVar12;
    }
  } while( true );
}

Assistant:

static bool InitPencilmarkByBox(const char *input, State &state) {
        char buf[736]; // make sure unaligned 16 byte cell reads won't go past end of buffer
        memcpy(&buf, input, 729);
        for (int box_i = 0; box_i < 3; box_i++) {
            for (int box_j = 0; box_j < 3; box_j++) {
                Cells16 box_candidates = Cells16::All(kAll);
                for (int elm_i = 0; elm_i < 3; elm_i++) {
                    for (int elm_j = 0; elm_j < 3; elm_j++) {
                        int cell = box_i * 27 + elm_i * 9 + box_j * 3 + elm_j;
                        auto cell_eliminations = WhichDots16(&buf[cell * 9]);
                        box_candidates.Insert(elm_i * 4 + elm_j, kAll & ~cell_eliminations);
                    }
                }
                if (!BoxRestrict<0>(state, box_i * 3 + box_j, box_candidates)) return false;
            }
        }
        return true;
    }